

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O3

void ImGui::TableSaveSettings(ImGuiTable *table)

{
  float fVar1;
  uint uVar2;
  byte bVar3;
  ImGuiContext_conflict1 *pIVar4;
  int iVar5;
  ImGuiTableSettings *p;
  ImGuiTableColumn *pIVar6;
  ImGuiTableSettings *pIVar7;
  byte bVar8;
  byte bVar9;
  bool bVar10;
  float fVar11;
  
  table->IsSettingsDirty = false;
  pIVar4 = GImGui;
  if ((table->Flags & 0x10) != 0) {
    return;
  }
  p = TableGetBoundSettings(table);
  if (p == (ImGuiTableSettings *)0x0) {
    p = TableSettingsCreate(table->ID,table->ColumnsCount);
    iVar5 = ImChunkStream<ImGuiTableSettings>::offset_from_ptr(&pIVar4->SettingsTables,p);
    table->SettingsOffset = iVar5;
  }
  iVar5 = table->ColumnsCount;
  p->ColumnsCount = (char)iVar5;
  if (p->ID == table->ID) {
    if (((char)iVar5 == iVar5) && (iVar5 <= p->ColumnsCountMax)) {
      pIVar6 = (table->Columns).Data;
      p->SaveFlags = 0;
      fVar11 = 0.0;
      if (0 < iVar5) {
        pIVar7 = p + 1;
        iVar5 = 0;
        bVar9 = 0;
        do {
          bVar3 = bVar9;
          fVar1 = *(float *)((long)&pIVar6->WidthRequest + (ulong)(pIVar6->Flags & 8));
          pIVar7->ID = (ImGuiID)fVar1;
          *(char *)&pIVar7->RefScale = (char)iVar5;
          *(ImGuiTableColumnIdx *)((long)&pIVar7->RefScale + 1) = pIVar6->DisplayOrder;
          *(ImGuiTableColumnIdx *)((long)&pIVar7->RefScale + 2) = pIVar6->SortOrder;
          bVar8 = pIVar6->field_0x65 & 3;
          bVar9 = *(byte *)((long)&pIVar7->RefScale + 3);
          *(byte *)((long)&pIVar7->RefScale + 3) = bVar9 & 0xfc | bVar8;
          bVar9 = bVar9 & 0xf8 | bVar8 | pIVar6->IsUserEnabled << 2;
          *(byte *)((long)&pIVar7->RefScale + 3) = bVar9;
          *(byte *)((long)&pIVar7->RefScale + 3) = bVar9 & 0xf7 | (byte)pIVar6->Flags & 8;
          uVar2 = pIVar6->Flags;
          bVar10 = (uVar2 & 8) == 0;
          if ((fVar1 != pIVar6->InitStretchWeightOrWidth) ||
             (NAN(fVar1) || NAN(pIVar6->InitStretchWeightOrWidth))) {
            *(byte *)&p->SaveFlags = (byte)p->SaveFlags | 1;
          }
          if (iVar5 != pIVar6->DisplayOrder) {
            *(byte *)&p->SaveFlags = (byte)p->SaveFlags | 2;
          }
          if (pIVar6->SortOrder != -1) {
            *(byte *)&p->SaveFlags = (byte)p->SaveFlags | 8;
          }
          if ((uVar2 >> 1 & 1) == (uint)pIVar6->IsUserEnabled) {
            *(byte *)&p->SaveFlags = (byte)p->SaveFlags | 4;
          }
          iVar5 = iVar5 + 1;
          pIVar6 = pIVar6 + 1;
          pIVar7 = (ImGuiTableSettings *)&pIVar7->ColumnsCount;
          bVar9 = bVar3 | bVar10;
        } while (iVar5 < table->ColumnsCount);
        p->SaveFlags = p->SaveFlags & table->Flags;
        if ((bool)(bVar3 | bVar10)) {
          fVar11 = table->RefScale;
        }
      }
      p->RefScale = fVar11;
      MarkIniSettingsDirty();
      return;
    }
    __assert_fail("settings->ColumnsCount == table->ColumnsCount && settings->ColumnsCountMax >= settings->ColumnsCount"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imgui_tables.cpp"
                  ,0xc92,"void ImGui::TableSaveSettings(ImGuiTable *)");
  }
  __assert_fail("settings->ID == table->ID",
                "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imgui_tables.cpp"
                ,0xc91,"void ImGui::TableSaveSettings(ImGuiTable *)");
}

Assistant:

void ImGui::TableSaveSettings(ImGuiTable* table)
{
    table->IsSettingsDirty = false;
    if (table->Flags & ImGuiTableFlags_NoSavedSettings)
        return;

    // Bind or create settings data
    ImGuiContext& g = *GImGui;
    ImGuiTableSettings* settings = TableGetBoundSettings(table);
    if (settings == NULL)
    {
        settings = TableSettingsCreate(table->ID, table->ColumnsCount);
        table->SettingsOffset = g.SettingsTables.offset_from_ptr(settings);
    }
    settings->ColumnsCount = (ImGuiTableColumnIdx)table->ColumnsCount;

    // Serialize ImGuiTable/ImGuiTableColumn into ImGuiTableSettings/ImGuiTableColumnSettings
    IM_ASSERT(settings->ID == table->ID);
    IM_ASSERT(settings->ColumnsCount == table->ColumnsCount && settings->ColumnsCountMax >= settings->ColumnsCount);
    ImGuiTableColumn* column = table->Columns.Data;
    ImGuiTableColumnSettings* column_settings = settings->GetColumnSettings();

    bool save_ref_scale = false;
    settings->SaveFlags = ImGuiTableFlags_None;
    for (int n = 0; n < table->ColumnsCount; n++, column++, column_settings++)
    {
        const float width_or_weight = (column->Flags & ImGuiTableColumnFlags_WidthStretch) ? column->StretchWeight : column->WidthRequest;
        column_settings->WidthOrWeight = width_or_weight;
        column_settings->Index = (ImGuiTableColumnIdx)n;
        column_settings->DisplayOrder = column->DisplayOrder;
        column_settings->SortOrder = column->SortOrder;
        column_settings->SortDirection = column->SortDirection;
        column_settings->IsEnabled = column->IsUserEnabled;
        column_settings->IsStretch = (column->Flags & ImGuiTableColumnFlags_WidthStretch) ? 1 : 0;
        if ((column->Flags & ImGuiTableColumnFlags_WidthStretch) == 0)
            save_ref_scale = true;

        // We skip saving some data in the .ini file when they are unnecessary to restore our state.
        // Note that fixed width where initial width was derived from auto-fit will always be saved as InitStretchWeightOrWidth will be 0.0f.
        // FIXME-TABLE: We don't have logic to easily compare SortOrder to DefaultSortOrder yet so it's always saved when present.
        if (width_or_weight != column->InitStretchWeightOrWidth)
            settings->SaveFlags |= ImGuiTableFlags_Resizable;
        if (column->DisplayOrder != n)
            settings->SaveFlags |= ImGuiTableFlags_Reorderable;
        if (column->SortOrder != -1)
            settings->SaveFlags |= ImGuiTableFlags_Sortable;
        if (column->IsUserEnabled != ((column->Flags & ImGuiTableColumnFlags_DefaultHide) == 0))
            settings->SaveFlags |= ImGuiTableFlags_Hideable;
    }
    settings->SaveFlags &= table->Flags;
    settings->RefScale = save_ref_scale ? table->RefScale : 0.0f;

    MarkIniSettingsDirty();
}